

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtentBuilder.h
# Opt level: O2

Extent<double> *
Parfait::ExtentBuilder::intersection<double>
          (Extent<double> *__return_storage_ptr__,Extent<double> *e1,Extent<double> *e2)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int i;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  bVar3 = Extent<double>::contains(e1,e2);
  if (bVar3) {
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      dVar1 = (e2->lo).pos._M_elems[lVar4];
      uVar5 = SUB84(dVar1,0);
      uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar2 = (e1->lo).pos._M_elems[lVar4];
      if (dVar1 <= dVar2) {
        uVar5 = SUB84(dVar2,0);
        uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
      }
      (__return_storage_ptr__->lo).pos._M_elems[lVar4] = (double)CONCAT44(uVar6,uVar5);
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      dVar1 = (e2->hi).pos._M_elems[lVar4];
      uVar5 = SUB84(dVar1,0);
      uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar2 = (e1->hi).pos._M_elems[lVar4];
      if (dVar2 <= dVar1) {
        uVar5 = SUB84(dVar2,0);
        uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
      }
      (__return_storage_ptr__->hi).pos._M_elems[lVar4] = (double)CONCAT44(uVar6,uVar5);
    }
  }
  else {
    (__return_storage_ptr__->lo).pos._M_elems[0] = 1.79769313486232e+308;
    (__return_storage_ptr__->lo).pos._M_elems[1] = 1.79769313486232e+308;
    (__return_storage_ptr__->lo).pos._M_elems[2] = 1.79769313486232e+308;
    (__return_storage_ptr__->hi).pos._M_elems[0] = -1.79769313486232e+308;
    (__return_storage_ptr__->hi).pos._M_elems[1] = -1.79769313486232e+308;
    (__return_storage_ptr__->hi).pos._M_elems[2] = -1.79769313486232e+308;
  }
  return __return_storage_ptr__;
}

Assistant:

Extent<T> intersection(Extent<T>& e1, const Extent<T>& e2) {
            if(not e1.contains(e2))
                return createEmptyBuildableExtent<T>();
            Extent<T> e;
            for(int i = 0; i < 3; i++)
                e.lo[i] = (e1.lo[i] < e2.lo[i])?(e2.lo[i]):(e1.lo[i]);

            for(int i = 0; i < 3; i++)
                e.hi[i] = (e1.hi[i] > e2.hi[i])?(e2.hi[i]):(e1.hi[i]);
            return e;
        }